

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

string * __thiscall
cmLocalUnixMakefileGenerator3::GetTargetDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalUnixMakefileGenerator3 *this,
          cmGeneratorTarget *target)

{
  string *psVar1;
  cmAlphaNum local_70;
  cmAlphaNum local_40;
  
  local_40.View_._M_len = 0xb;
  local_40.View_._M_str = "CMakeFiles/";
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  local_70.View_._M_str = (psVar1->_M_dataplus)._M_p;
  local_70.View_._M_len = psVar1->_M_string_length;
  cmStrCat<>(__return_storage_ptr__,&local_40,&local_70);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalUnixMakefileGenerator3::GetTargetDirectory(
  cmGeneratorTarget const* target) const
{
  std::string dir = cmStrCat("CMakeFiles/", target->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}